

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzsparseblockdiagonal.cpp
# Opt level: O2

void __thiscall
TPZSparseBlockDiagonal<float>::Gather
          (TPZSparseBlockDiagonal<float> *this,TPZFMatrix<float> *in,TPZFMatrix<float> *out)

{
  long lVar1;
  float *pfVar2;
  long lVar3;
  long col;
  long row;
  float extraout_XMM0_Da;
  
  lVar3 = (this->fBlock).fNElements;
  col = 0;
  if (lVar3 < 1) {
    lVar3 = col;
  }
  lVar1 = (in->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol;
  if (lVar1 < 1) {
    lVar1 = col;
  }
  for (; col != lVar1; col = col + 1) {
    for (row = 0; lVar3 != row; row = row + 1) {
      (*(in->super_TPZMatrix<float>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x24])
                (in,(this->fBlock).fStore[row],col);
      pfVar2 = TPZFMatrix<float>::operator()(out,row,col);
      *pfVar2 = extraout_XMM0_Da;
    }
  }
  return;
}

Assistant:

void TPZSparseBlockDiagonal<TVar>::Gather(const TPZFMatrix<TVar> &in, TPZFMatrix<TVar> &out) const
{
    int64_t neq = fBlock.NElements();
    int64_t nc = in.Cols();
    int64_t ieq,ic;
    for(ic=0; ic<nc; ic++)
    {
		for(ieq=0; ieq<neq; ieq++) out(ieq,ic) = in.GetVal(fBlock[ieq],ic);
    }
}